

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

void __thiscall Potassco::StringBuilder::~StringBuilder(StringBuilder *this)

{
  string *psVar1;
  pointer pcVar2;
  
  if ((this->field_0).sbo_[0x3f] == 'A') {
    psVar1 = (this->field_0).str_;
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
    return;
  }
  return;
}

Assistant:

StringBuilder::~StringBuilder() {
	if (tag() == (Str|Own)) {
		delete str_;
	}
}